

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

int nng_stat_unit(nng_stat *stat)

{
  return stat->s_info->si_unit;
}

Assistant:

int
nng_stat_unit(const nng_stat *stat)
{
#if NNG_ENABLE_STATS
	return (stat->s_info->si_unit);
#else
	NNI_ARG_UNUSED(stat);
	return (NNG_UNIT_NONE);
#endif
}